

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O3

void __thiscall RleTaskScheduler::process(RleTaskScheduler *this,VTask *task)

{
  atomic<unsigned_int> *paVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  
  LOCK();
  paVar1 = &this->_index;
  uVar2 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  uVar4 = this->_count;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      bVar3 = TaskQueue<std::shared_ptr<VRleTask>_>::try_push
                        ((this->_q).
                         super__Vector_base<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                         (ulong)(uVar2 + uVar5) % (ulong)uVar4,task);
      if (bVar3) {
        return;
      }
      uVar5 = uVar5 + 1;
      uVar4 = this->_count;
    } while (uVar5 != uVar4);
    if (uVar5 != 0) {
      TaskQueue<std::shared_ptr<VRleTask>_>::push
                ((this->_q).
                 super__Vector_base<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (ulong)uVar2 % (ulong)uVar5,task);
      return;
    }
  }
  return;
}

Assistant:

void process(VTask task)
    {
        auto i = _index++;

        for (unsigned n = 0; n != _count; ++n) {
            if (_q[(i + n) % _count].try_push(std::move(task))) return;
        }

        if (_count > 0) {
            _q[i % _count].push(std::move(task));
        }
    }